

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

void EntityRelationTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  typed_option<float> *op;
  typed_option<float> *this;
  example *new_ele;
  undefined8 *in_RDX;
  search *in_RDI;
  size_t a;
  wclass default_wclass;
  example *ldf_examples;
  int i_1;
  int i;
  option_group_definition new_options;
  task_data *my_task_data;
  string *in_stack_fffffffffffff878;
  typed_option<float> *in_stack_fffffffffffff880;
  string *in_stack_fffffffffffff888;
  allocator *paVar1;
  typed_option<float> *in_stack_fffffffffffff890;
  typed_option<float> *in_stack_fffffffffffff8c8;
  option_group_definition *in_stack_fffffffffffff8d0;
  option_group_definition *this_00;
  ulong local_660;
  undefined1 local_658 [16];
  example *local_648;
  int local_63c;
  int local_638;
  int local_634;
  int local_630;
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [76];
  uint32_t in_stack_fffffffffffffa4c;
  search *in_stack_fffffffffffffa50;
  allocator local_539;
  string local_538 [39];
  undefined1 local_511 [33];
  typed_option<float> local_4f0;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  typed_option<float> local_400;
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  typed_option<bool> local_310;
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  typed_option<float> local_220;
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  typed_option<float> local_130;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [56];
  task_data *local_20;
  undefined8 *local_18;
  search *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = (task_data *)operator_new(0x70);
  local_20->ldf_entity = (example *)0x0;
  local_20->ldf_relation = (example *)0x0;
  (local_20->y_allowed_relation).erase_count = 0;
  local_20->search_order = 0;
  (local_20->y_allowed_relation)._end = (uint *)0x0;
  (local_20->y_allowed_relation).end_array = (uint *)0x0;
  (local_20->y_allowed_entity).erase_count = 0;
  (local_20->y_allowed_relation)._begin = (uint *)0x0;
  (local_20->y_allowed_entity)._end = (uint *)0x0;
  (local_20->y_allowed_entity).end_array = (uint *)0x0;
  local_20->constraints = false;
  local_20->allow_skip = false;
  *(undefined6 *)&local_20->field_0x12 = 0;
  (local_20->y_allowed_entity)._begin = (uint *)0x0;
  local_20->relation_none_cost = 0.0;
  local_20->entity_cost = 0.0;
  local_20->relation_cost = 0.0;
  local_20->skip_cost = 0.0;
  Search::search::set_task_data<EntityRelationTask::task_data>(local_8,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Entity Relation Options",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"relation_cost",&local_151);
  VW::config::make_option<float>(in_stack_fffffffffffff888,(float *)in_stack_fffffffffffff880);
  VW::config::typed_option<float>::keep(&local_130,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff890,(float)((ulong)in_stack_fffffffffffff888 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"Relation Cost",&local_179);
  VW::config::typed_option<float>::help(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"entity_cost",&local_241);
  VW::config::make_option<float>(in_stack_fffffffffffff888,(float *)in_stack_fffffffffffff880);
  VW::config::typed_option<float>::keep(&local_220,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff890,(float)((ulong)in_stack_fffffffffffff888 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"Entity Cost",&local_269);
  VW::config::typed_option<float>::help(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"constraints",&local_331);
  VW::config::make_option<bool>(in_stack_fffffffffffff888,(bool *)in_stack_fffffffffffff880);
  VW::config::typed_option<bool>::keep(&local_310,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"Use Constraints",&local_359);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff8d0,(typed_option<bool> *)in_stack_fffffffffffff8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"relation_none_cost",&local_421);
  VW::config::make_option<float>(in_stack_fffffffffffff888,(float *)in_stack_fffffffffffff880);
  VW::config::typed_option<float>::keep(&local_400,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff890,(float)((ulong)in_stack_fffffffffffff888 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"None Relation Cost",&local_449);
  VW::config::typed_option<float>::help(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  this_00 = (option_group_definition *)local_511;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_511 + 1),"skip_cost",(allocator *)this_00);
  VW::config::make_option<float>(in_stack_fffffffffffff888,(float *)in_stack_fffffffffffff880);
  op = VW::config::typed_option<float>::keep(&local_4f0,true);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff890,(float)((ulong)in_stack_fffffffffffff888 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"Skip Cost (only used when search_order = skip",&local_539)
  ;
  VW::config::typed_option<float>::help(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(this_00,op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"search_order",&local_601);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff888,(unsigned_long *)in_stack_fffffffffffff880);
  VW::config::typed_option<unsigned_long>::keep
            ((typed_option<unsigned_long> *)(local_600 + 0x20),true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff890,
             (unsigned_long)in_stack_fffffffffffff888);
  paVar1 = &local_629;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_628,"Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)",paVar1);
  this = (typed_option<float> *)
         VW::config::typed_option<unsigned_long>::help
                   ((typed_option<unsigned_long> *)in_stack_fffffffffffff880,
                    in_stack_fffffffffffff878);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (this_00,(typed_option<unsigned_long> *)op);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)this);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string((string *)(local_511 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_511);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)this);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  VW::config::typed_option<float>::~typed_option(this);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  (**(code **)*local_18)(local_18,local_58);
  for (local_630 = 1; local_630 < 5; local_630 = local_630 + 1) {
    local_634 = local_630;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffff878);
  }
  for (local_638 = 5; local_638 < 0xb; local_638 = local_638 + 1) {
    local_63c = local_638;
    v_array<unsigned_int>::push_back
              ((v_array<unsigned_int> *)this,(uint *)in_stack_fffffffffffff878);
  }
  local_20->allow_skip = false;
  if ((local_20->search_order == 3) || (local_20->search_order == 4)) {
    new_ele = VW::alloc_examples((size_t)paVar1,(size_t)this);
    local_648 = new_ele;
    memset(local_658,0,0x10);
    for (local_660 = 0; local_660 < 10; local_660 = local_660 + 1) {
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)this,(wclass *)new_ele);
    }
    local_20->ldf_entity = local_648;
    local_20->ldf_relation = local_648 + 4;
    Search::search::set_options(in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
  }
  else {
    Search::search::set_options(in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
  }
  Search::search::set_num_learners(local_8,2);
  if (local_20->search_order == 4) {
    Search::search::set_num_learners(local_8,3);
  }
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)this);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* my_task_data = new task_data();
  sch.set_task_data<task_data>(my_task_data);

  option_group_definition new_options("Entity Relation Options");
  new_options
      .add(make_option("relation_cost", my_task_data->relation_cost).keep().default_value(1.f).help("Relation Cost"))
      .add(make_option("entity_cost", my_task_data->entity_cost).keep().default_value(1.f).help("Entity Cost"))
      .add(make_option("constraints", my_task_data->constraints).keep().help("Use Constraints"))
      .add(make_option("relation_none_cost", my_task_data->relation_none_cost)
               .keep()
               .default_value(0.5f)
               .help("None Relation Cost"))
      .add(make_option("skip_cost", my_task_data->skip_cost)
               .keep()
               .default_value(0.01f)
               .help("Skip Cost (only used when search_order = skip"))
      .add(make_option("search_order", my_task_data->search_order)
               .keep()
               .default_value(0)
               .help("Search Order 0: EntityFirst 1: Mix 2: Skip 3: EntityFirst(LDF)"));
  options.add_and_parse(new_options);

  // setup entity and relation labels
  // Entity label 1:E_Other 2:E_Peop 3:E_Org 4:E_Loc
  // Relation label 5:R_Live_in 6:R_OrgBased_in 7:R_Located_in 8:R_Work_For 9:R_Kill 10:R_None
  for (int i = 1; i < 5; i++) my_task_data->y_allowed_entity.push_back(i);

  for (int i = 5; i < 11; i++) my_task_data->y_allowed_relation.push_back(i);

  my_task_data->allow_skip = false;

  if (my_task_data->search_order != 3 && my_task_data->search_order != 4)
  {
    sch.set_options(0);
  }
  else
  {
    example* ldf_examples = VW::alloc_examples(sizeof(CS::label), 10);
    CS::wclass default_wclass = {0., 0, 0., 0.};
    for (size_t a = 0; a < 10; a++)
    {
      ldf_examples[a].l.cs.costs.push_back(default_wclass);
    }
    my_task_data->ldf_entity = ldf_examples;
    my_task_data->ldf_relation = ldf_examples + 4;
    sch.set_options(Search::IS_LDF);
  }

  sch.set_num_learners(2);
  if (my_task_data->search_order == 4)
    sch.set_num_learners(3);
}